

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_html.c
# Opt level: O1

int mpt_color_html(mpt_color *color,char *txt)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  uint *puVar4;
  bool bVar5;
  uint8_t col [4];
  char part [4];
  uint local_30;
  char local_2c;
  char local_2b;
  undefined2 local_2a;
  
  local_30 = 0xff000000;
  if (txt == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -2;
  }
  else {
    local_2a = 0x400;
    puVar4 = &local_30;
    uVar3 = 0;
    do {
      bVar5 = local_2a._1_1_ == '\0';
      local_2a = CONCAT11(local_2a._1_1_ + -1,(undefined1)local_2a);
      if (bVar5) {
LAB_00106327:
        if (color == (mpt_color *)0x0) {
          return (int)uVar3;
        }
        mpt_color_set(color,local_30 & 0xff,local_30 >> 8 & 0xff,local_30 >> 0x10 & 0xff);
        mpt_color_setalpha(color,local_30 >> 0x18);
        return (int)uVar3;
      }
      local_2c = txt[uVar3];
      if (local_2c == '\0') {
        uVar3 = (ulong)((int)uVar3 + 1);
        goto LAB_00106327;
      }
      local_2b = txt[uVar3 + 1];
      if (local_2b == '\0') {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        break;
      }
      uVar3 = uVar3 + 2;
      iVar1 = mpt_cuint8(puVar4,&local_2c,0x10,0);
      puVar4 = (uint *)((long)puVar4 + 1);
    } while (-1 < iVar1);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

extern int mpt_color_html(MPT_STRUCT(color) *color, const char *txt)
{
	uint8_t	col[4] = { 0, 0, 0, 255 };
	char	part[4];
	int	len, i = 0;
	
	if (!txt) {
		errno = EINVAL; return -2;
	}
	part[2] = '\0';
	part[3] = 4;
	len = 0;
	
	while (part[3]--) {
		if (!(part[0] = txt[len++]))
			break;
		
		if (!(part[1] = txt[len++])) {
			errno = EINVAL; return -1;
		}
		if (mpt_cuint8(&col[i++], part, 0x10, 0) < 0)
			return -1;
	}
	if (color) {
		mpt_color_set(color, col[0], col[1], col[2]);
		mpt_color_setalpha(color, col[3]);
	}
	return len;
}